

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::ContainerPrinter::
     PrintValue<std::vector<bfy_iovec,std::allocator<bfy_iovec>>,void>
               (vector<bfy_iovec,_std::allocator<bfy_iovec>_> *container,ostream *os)

{
  pointer pbVar1;
  long lVar2;
  pointer io;
  
  std::operator<<(os,'{');
  io = (container->super__Vector_base<bfy_iovec,_std::allocator<bfy_iovec>_>)._M_impl.
       super__Vector_impl_data._M_start;
  pbVar1 = (container->super__Vector_base<bfy_iovec,_std::allocator<bfy_iovec>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar2 = 0;
  do {
    if (io == pbVar1) {
      if (lVar2 != 0) {
LAB_0012d424:
        std::operator<<(os,' ');
      }
      std::operator<<(os,'}');
      return;
    }
    if ((lVar2 != 0) && (std::operator<<(os,','), lVar2 == 0x20)) {
      std::operator<<(os," ...");
      goto LAB_0012d424;
    }
    std::operator<<(os,' ');
    ::operator<<(os,io);
    lVar2 = lVar2 + 1;
    io = io + 1;
  } while( true );
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }